

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

_Bool sysbvm_stringSlice_equalsFunction(void *element,sysbvm_tuple_t setElement)

{
  _Bool _Var1;
  int iVar2;
  size_t __n;
  
  _Var1 = sysbvm_tuple_isBytes((ulong)(setElement == 0));
  if (!_Var1) {
    if ((setElement & 0xf) == 0 && setElement != 0) {
      __n = (size_t)*(uint *)(setElement + 0xc);
    }
    else {
      __n = 0;
    }
    if (__n == *(size_t *)((long)element + 8)) {
      iVar2 = bcmp(*element,(void *)(setElement + 0x10),__n);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool sysbvm_stringSlice_equalsFunction(void *element, sysbvm_tuple_t setElement)
{
    sysbvm_stringSlice_t *stringSlice = (sysbvm_stringSlice_t*)element;
    if(sysbvm_tuple_isBytes(!setElement))
        return false;

    size_t setElementSize = sysbvm_tuple_getSizeInBytes(setElement);
    if(setElementSize != stringSlice->size)
        return false;

    return memcmp(stringSlice->elements, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(setElement)->bytes, setElementSize) == 0;
}